

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::SearchCachedPCRE(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  bool bVar1;
  string *__lhs;
  ostream *poVar2;
  LogMessage local_510;
  LogMessage local_390;
  int local_20c;
  undefined1 local_208 [4];
  int i;
  undefined1 local_78 [8];
  PCRE re;
  bool expect_match_local;
  Anchor anchor_local;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  re.stack_limit_._3_1_ = expect_match;
  re.hit_limit_ = anchor;
  PCRE::PCRE((PCRE *)local_78,regexp,EnabledCompileOptions);
  __lhs = PCRE::error_abi_cxx11_((PCRE *)local_78);
  bVar1 = std::operator==(__lhs,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x400);
    poVar2 = LogMessage::stream((LogMessage *)local_208);
    std::operator<<(poVar2,"Check failed: (re.error()) == (\"\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_208);
  }
  for (local_20c = 0; local_20c < iters; local_20c = local_20c + 1) {
    if (re.hit_limit_ == 1) {
      bVar1 = PCRE::FullMatchFunctor::operator()
                        ((FullMatchFunctor *)&PCRE::FullMatch,text,(PCRE *)local_78,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
      if (bVar1 != (bool)(re.stack_limit_._3_1_ & 1)) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_390,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x403);
        poVar2 = LogMessage::stream(&local_390);
        std::operator<<(poVar2,"Check failed: (PCRE::FullMatch(text, re)) == (expect_match)");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_390);
      }
    }
    else {
      bVar1 = PCRE::PartialMatchFunctor::operator()
                        ((PartialMatchFunctor *)&PCRE::PartialMatch,text,(PCRE *)local_78,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                         (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
      if (bVar1 != (bool)(re.stack_limit_._3_1_ & 1)) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_510,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x405);
        poVar2 = LogMessage::stream(&local_510);
        std::operator<<(poVar2,"Check failed: (PCRE::PartialMatch(text, re)) == (expect_match)");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_510);
      }
    }
  }
  PCRE::~PCRE((PCRE *)local_78);
  return;
}

Assistant:

void SearchCachedPCRE(int iters, const char* regexp, const StringPiece& text,
                     Prog::Anchor anchor, bool expect_match) {
  PCRE re(regexp, PCRE::UTF8);
  CHECK_EQ(re.error(), "");
  for (int i = 0; i < iters; i++) {
    if (anchor == Prog::kAnchored)
      CHECK_EQ(PCRE::FullMatch(text, re), expect_match);
    else
      CHECK_EQ(PCRE::PartialMatch(text, re), expect_match);
  }
}